

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QCircuit.hpp
# Opt level: O0

void __thiscall
qclab::QCircuit<std::complex<float>,_qclab::QObject<std::complex<float>_>_>::QCircuit
          (QCircuit<std::complex<float>,_qclab::QObject<std::complex<float>_>_> *this,int nbQubits,
          int offset,int nbGates)

{
  size_type __n;
  allocator<std::unique_ptr<qclab::QObject<std::complex<float>_>,_std::default_delete<qclab::QObject<std::complex<float>_>_>_>_>
  local_1d;
  int local_1c;
  int local_18;
  int nbGates_local;
  int offset_local;
  int nbQubits_local;
  QCircuit<std::complex<float>,_qclab::QObject<std::complex<float>_>_> *this_local;
  
  local_1c = nbGates;
  local_18 = offset;
  nbGates_local = nbQubits;
  _offset_local = this;
  QObject<std::complex<float>_>::QObject(&this->super_QObject<std::complex<float>_>);
  QAdjustable::QAdjustable(&this->super_QAdjustable,false);
  (this->super_QObject<std::complex<float>_>)._vptr_QObject = (_func_int **)&PTR_nbQubits_00753fa8;
  this->nbQubits_ = nbGates_local;
  this->offset_ = local_18;
  __n = (size_type)local_1c;
  std::
  allocator<std::unique_ptr<qclab::QObject<std::complex<float>_>,_std::default_delete<qclab::QObject<std::complex<float>_>_>_>_>
  ::allocator(&local_1d);
  std::
  vector<std::unique_ptr<qclab::QObject<std::complex<float>_>,_std::default_delete<qclab::QObject<std::complex<float>_>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<std::complex<float>_>,_std::default_delete<qclab::QObject<std::complex<float>_>_>_>_>_>
  ::vector(&this->gates_,__n,&local_1d);
  std::
  allocator<std::unique_ptr<qclab::QObject<std::complex<float>_>,_std::default_delete<qclab::QObject<std::complex<float>_>_>_>_>
  ::~allocator(&local_1d);
  if (nbGates_local < 1) {
    __assert_fail("nbQubits > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/QCircuit.hpp"
                  ,0x4c,
                  "qclab::QCircuit<std::complex<float>>::QCircuit(const int, const int, const int) [T = std::complex<float>, G = qclab::QObject<std::complex<float>>]"
                 );
  }
  if (-1 < local_18) {
    if (-1 < local_1c) {
      return;
    }
    __assert_fail("nbGates >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/QCircuit.hpp"
                  ,0x4e,
                  "qclab::QCircuit<std::complex<float>>::QCircuit(const int, const int, const int) [T = std::complex<float>, G = qclab::QObject<std::complex<float>>]"
                 );
  }
  __assert_fail("offset >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/QCircuit.hpp"
                ,0x4d,
                "qclab::QCircuit<std::complex<float>>::QCircuit(const int, const int, const int) [T = std::complex<float>, G = qclab::QObject<std::complex<float>>]"
               );
}

Assistant:

QCircuit( const int nbQubits , const int offset , const int nbGates )
      : nbQubits_( nbQubits )
      , offset_( offset )
      , gates_( nbGates )
      {
        assert( nbQubits > 0 ) ;
        assert( offset >= 0 ) ;
        assert( nbGates >= 0 ) ;
      }